

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_api_suite::test_ctor(void)

{
  anon_struct_8_1_6167ffdf_for_sum *paVar1;
  bool bVar2;
  undefined1 auStack_148 [8];
  moment_skewness<double,_4> massign;
  moment_skewness<double,_4> mover;
  moment_skewness<double,_4> assign;
  moment_skewness<double,_4> copy;
  moment_skewness<double,_4> filter;
  
  paVar1 = &copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
            super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
            super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
            sum;
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)3> *)paVar1);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)paVar1,1.0
            );
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     paVar1);
  boost::detail::test_impl
            ("!filter.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1aa,"void skewness_api_suite::test_ctor()",!bVar2);
  copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.sum;
  copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     &assign.
                      super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>
                      .passive.sum);
  boost::detail::test_impl
            ("!copy.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1ae,"void skewness_api_suite::test_ctor()",!bVar2);
  paVar1 = &mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
            super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
            super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
            sum;
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)3> *)paVar1);
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.sum;
  assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       filter.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     paVar1);
  boost::detail::test_impl
            ("!assign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1b3,"void skewness_api_suite::test_ctor()",!bVar2);
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.sum;
  mover.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       copy.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     &massign.
                      super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>
                      .
                      super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>
                      .passive.sum);
  boost::detail::test_impl
            ("!mover.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1b7,"void skewness_api_suite::test_ctor()",!bVar2);
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)3> *)auStack_148);
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.sum;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.passive.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.count =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.count;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.sum =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.sum;
  auStack_148 = (undefined1  [8])
                mover.
                super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
                super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
                super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.
                passive.sum.skewness;
  massign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
  super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
  super_basic_moment<double,_(trial::online::with)2>.
  super_basic_moment<double,_(trial::online::with)1>.member.mean =
       assign.super_basic_moment<double,_4UL,_(trial::online::with)3,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)2,_(trial::online::with)3>.
       super_basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>.active.
       super_basic_moment<double,_(trial::online::with)2>.
       super_basic_moment<double,_(trial::online::with)1>.member.mean;
  bVar2 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::empty
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     auStack_148);
  boost::detail::test_impl
            ("!massign.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1bc,"void skewness_api_suite::test_ctor()",(bool)(bVar2 - 1U & 1));
  return;
}

Assistant:

void test_ctor()
{
    interim::moment_skewness<double, 4> filter;
    filter.push(1.0);
    TRIAL_TEST(!filter.empty());

    // Copy constructor
    interim::moment_skewness<double, 4> copy(filter);
    TRIAL_TEST(!copy.empty());

    // Copy assignment
    interim::moment_skewness<double, 4> assign;
    assign = filter;
    TRIAL_TEST(!assign.empty());

    // Move constructor
    interim::moment_skewness<double, 4> mover(std::move(copy));
    TRIAL_TEST(!mover.empty());

    // Move assignment
    interim::moment_skewness<double, 4> massign;
    massign = std::move(assign);
    TRIAL_TEST(!massign.empty());
}